

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint ssize;
  double *pdVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  value_type vVar4;
  
  ssize = (((((((fadexpr->fadexpr_).left_)->fadexpr_).left_)->fadexpr_).expr_)->dx_).num_elts;
  if (ssize != (this->dx_).num_elts) {
    Vector<double>::resize(&this->dx_,ssize);
  }
  if (ssize != 0) {
    pdVar1 = (this->dx_).ptr_to_data;
    uVar2 = 0;
    if (0 < (int)ssize) {
      uVar2 = (ulong)ssize;
    }
    if ((((((((fadexpr->fadexpr_).left_)->fadexpr_).left_)->fadexpr_).expr_)->dx_).num_elts == 0) {
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        vVar4 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
                ::dx(&fadexpr->fadexpr_,(int)uVar3);
        pdVar1[uVar3] = vVar4;
      }
    }
    else {
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        vVar4 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
                ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar3);
        pdVar1[uVar3] = vVar4;
      }
    }
  }
  vVar4 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
          ::val(&fadexpr->fadexpr_);
  this->val_ = vVar4;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}